

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::isParameterName(ErrorsTest *this,GLenum maybe_pname)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = true;
  if (maybe_pname != 0x8866) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 3) break;
      uVar1 = uVar2 + 1;
    } while ((&DAT_01b01de4)[uVar2] != maybe_pname);
    bVar3 = uVar2 < 3;
  }
  return bVar3;
}

Assistant:

bool ErrorsTest::isParameterName(glw::GLenum maybe_pname)
{
	glw::GLenum pnames[]	 = { GL_QUERY_RESULT, GL_QUERY_RESULT_AVAILABLE, GL_QUERY_RESULT_NO_WAIT, GL_QUERY_TARGET };
	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		if (maybe_pname == pnames[i])
		{
			return true;
		}
	}

	return false;
}